

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O2

void __thiscall Pl_SHA2::resetBits(Pl_SHA2 *this,int bits)

{
  element_type *peVar1;
  logic_error *this_00;
  __shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  if (this->in_progress != true) {
    QPDFCryptoProvider::getImpl();
    std::__shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>,
               &_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
    peVar1 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_QPDFCryptoImpl[7])(peVar1,bits);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bit reset requested for in-progress SHA2 Pipeline");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Pl_SHA2::resetBits(int bits)
{
    if (this->in_progress) {
        throw std::logic_error("bit reset requested for in-progress SHA2 Pipeline");
    }
    this->crypto = QPDFCryptoProvider::getImpl();
    this->crypto->SHA2_init(bits);
}